

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readam.c
# Opt level: O1

int it_riff_am_process_pattern(IT_PATTERN *pattern,DUMBFILE *f,int len,int ver)

{
  uint uVar1;
  uint uVar2;
  int32 iVar3;
  int iVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  IT_ENTRY *entry;
  long lVar9;
  uint uVar10;
  bool bVar11;
  uint local_48;
  
  uVar2 = dumbfile_getc(f);
  uVar1 = uVar2 + 1;
  pattern->n_rows = uVar1;
  pattern->n_entries = 0;
  iVar3 = dumbfile_pos(f);
  lVar9 = (long)len + (long)iVar3 + -1;
  local_48 = uVar2 >> 0x1f;
  if (-1 < (int)uVar2) {
    uVar10 = local_48;
    uVar8 = 0;
    do {
      while( true ) {
        iVar4 = dumbfile_error(f);
        if ((iVar4 != 0) || (iVar5 = dumbfile_pos(f), lVar9 <= iVar5)) goto LAB_006eaaa4;
        uVar6 = dumbfile_getc(f);
        if (uVar6 == 0) break;
        if ((uVar6 & 0xe0) != 0) {
          pattern->n_entries = pattern->n_entries + 1;
          if ((char)uVar6 < '\0') {
            dumbfile_skip(f,2);
          }
          if ((uVar6 & 0x40) != 0) {
            dumbfile_skip(f,2);
          }
          if ((uVar6 & 0x20) != 0) {
            dumbfile_skip(f,1);
          }
        }
        if (uVar10 != 0) goto LAB_006eaaa4;
      }
      bVar11 = uVar8 != uVar2;
      uVar10 = (uint)((int)uVar2 <= (int)uVar8);
      uVar8 = uVar8 + 1;
    } while (bVar11);
  }
LAB_006eaaa4:
  if (pattern->n_entries == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = pattern->n_entries + uVar1;
    pattern->n_entries = iVar4;
    entry = (IT_ENTRY *)malloc((long)iVar4 * 7);
    pattern->entry = entry;
    if (entry == (IT_ENTRY *)0x0) {
      iVar4 = -1;
    }
    else {
      dumbfile_seek(f,(long)iVar3,0);
      if ((int)uVar2 < 0) {
        uVar8 = 0;
      }
      else {
        uVar10 = 0;
        do {
          while( true ) {
            iVar4 = dumbfile_error(f);
            uVar8 = uVar10;
            if ((iVar4 != 0) || (iVar3 = dumbfile_pos(f), lVar9 <= iVar3)) goto LAB_006eac42;
            uVar6 = dumbfile_getc(f);
            if (uVar6 != 0) break;
            entry->channel = 0xff;
            entry = entry + 1;
            bVar11 = uVar10 == uVar2;
            local_48 = (uint)((int)uVar2 <= (int)uVar10);
            uVar8 = uVar1;
            uVar10 = uVar10 + 1;
            if (bVar11) goto LAB_006eac42;
          }
          entry->channel = (byte)uVar6 & 0x1f;
          entry->mask = '\0';
          if ((uVar6 & 0xe0) != 0) {
            if ((char)(byte)uVar6 < '\0') {
              iVar4 = dumbfile_getc(f);
              iVar7 = dumbfile_getc(f);
              _dumb_it_xm_convert_effect(iVar7,iVar4,entry,0);
            }
            if ((uVar6 & 0x40) != 0) {
              iVar4 = dumbfile_getc(f);
              iVar7 = dumbfile_getc(f);
              if (iVar4 != 0) {
                entry->mask = entry->mask | 2;
                entry->instrument = (uchar)iVar4;
              }
              if (iVar7 != 0) {
                entry->mask = entry->mask | 1;
                entry->note = (char)iVar7 + 0xff;
              }
            }
            if ((uVar6 & 0x20) != 0) {
              iVar4 = dumbfile_getc(f);
              entry->mask = entry->mask | 4;
              if (ver != 0) {
                iVar4 = (iVar4 << 6) / 0x7f;
              }
              entry->volpan = (uchar)iVar4;
            }
            if (entry->mask != '\0') {
              entry = entry + 1;
            }
          }
        } while (local_48 == 0);
      }
LAB_006eac42:
      if ((int)uVar8 <= (int)uVar2) {
        iVar4 = (uVar2 - uVar8) + 1;
        do {
          entry->channel = 0xff;
          entry = entry + 1;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      iVar4 = ((int)entry - *(int *)&pattern->entry) * -0x49249249;
      pattern->n_entries = iVar4;
      iVar4 = -(uint)(iVar4 == 0);
    }
  }
  return iVar4;
}

Assistant:

static int it_riff_am_process_pattern( IT_PATTERN * pattern, DUMBFILE * f, int len, int ver )
{
    int nrows, row;
    long start, end;
	unsigned flags;
    int p, q, r;
	IT_ENTRY * entry;

    nrows = dumbfile_getc( f ) + 1;

	pattern->n_rows = nrows;

	len -= 1;

	pattern->n_entries = 0;

	row = 0;

    start = dumbfile_pos( f );
    end = start + len;

    while ( (row < nrows) && !dumbfile_error( f ) && (dumbfile_pos( f ) < end) ) {
        p = dumbfile_getc( f );
        if ( ! p ) {
			++ row;
			continue;
		}

        flags = p & 0xE0;

        if (flags) {
			++ pattern->n_entries;
            if (flags & 0x80) dumbfile_skip( f, 2 );
            if (flags & 0x40) dumbfile_skip( f, 2 );
            if (flags & 0x20) dumbfile_skip( f, 1 );
		}
	}

	if ( ! pattern->n_entries ) return 0;

	pattern->n_entries += nrows;

	pattern->entry = malloc( pattern->n_entries * sizeof( * pattern->entry ) );
	if ( ! pattern->entry ) return -1;

	entry = pattern->entry;

	row = 0;

    dumbfile_seek( f, start, DFS_SEEK_SET );

    while ( ( row < nrows ) && !dumbfile_error( f ) && ( dumbfile_pos( f ) < end ) )
	{
        p = dumbfile_getc( f );

        if ( ! p )
		{
			IT_SET_END_ROW( entry );
			++ entry;
			++ row;
			continue;
		}

        flags = p;
		entry->channel = flags & 0x1F;
		entry->mask = 0;

		if (flags & 0xE0)
		{
			if ( flags & 0x80 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                _dumb_it_xm_convert_effect( r, q, entry, 0 );
			}

			if ( flags & 0x40 )
			{
                q = dumbfile_getc( f );
                r = dumbfile_getc( f );
                if ( q )
				{
					entry->mask |= IT_ENTRY_INSTRUMENT;
                    entry->instrument = q;
				}
                if ( r )
				{
					entry->mask |= IT_ENTRY_NOTE;
                    entry->note = r - 1;
				}
			}

			if ( flags & 0x20 )
			{
                q = dumbfile_getc( f );
				entry->mask |= IT_ENTRY_VOLPAN;
                if ( ver == 0 ) entry->volpan = q;
                else entry->volpan = q * 64 / 127;
			}

			if (entry->mask) entry++;
		}
	}

	while ( row < nrows )
	{
		IT_SET_END_ROW( entry );
		++ entry;
		++ row;
	}

	pattern->n_entries = (int)(entry - pattern->entry);
	if ( ! pattern->n_entries ) return -1;

	return 0;
}